

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibTable.cpp
# Opt level: O2

int lib::table::Insert(State *state)

{
  bool bVar1;
  int iVar2;
  Table *this;
  size_t sVar3;
  Value *value;
  int index_00;
  size_t index;
  StackAPI api;
  
  luna::StackAPI::StackAPI(&api,state);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT>(&api,2,ValueT_Table);
  iVar2 = 0;
  if (bVar1) {
    iVar2 = luna::StackAPI::GetStackSize(&api);
    this = luna::StackAPI::GetTable(&api,0);
    sVar3 = luna::Table::ArraySize(this);
    index = sVar3 + 1;
    index_00 = 1;
    if ((iVar2 < 3) ||
       (bVar1 = GetNumber<unsigned_long>(&api,1,&index), index_00 = 2, iVar2 = 0, bVar1)) {
      sVar3 = index;
      value = luna::StackAPI::GetValue(&api,index_00);
      bVar1 = luna::Table::InsertArrayValue(this,sVar3,value);
      luna::StackAPI::PushBool(&api,bVar1);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int Insert(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(2, luna::ValueT_Table))
            return 0;

        auto params = api.GetStackSize();
        auto table = api.GetTable(0);
        auto index = table->ArraySize() + 1;
        int value = 1;

        if (params > 2)
        {
            if (!GetNumber(api, 1, index))
                return 0;

            value = 2;
        }

        api.PushBool(table->InsertArrayValue(index, *api.GetValue(value)));
        return 1;
    }